

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main_average(void)

{
  double b_00;
  double c_00;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  int iVar1;
  ostream *poVar2;
  reference pvVar3;
  double dVar4;
  allocator<double> local_169;
  double local_168;
  iterator local_160;
  size_type local_158;
  vector<double,_std::allocator<double>_> local_150;
  allocator<double> local_131;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  iterator local_110;
  size_type local_108;
  vector<double,_std::allocator<double>_> local_100;
  double local_e8;
  double d;
  double c;
  double b;
  double a;
  double dStack_c0;
  int i;
  double cost;
  double lastCost;
  vector<double,_std::allocator<double>_> output;
  value_type local_90;
  value_type local_88 [3];
  value_type local_70;
  undefined1 local_68 [8];
  vector<double,_std::allocator<double>_> data;
  FC_BPNN bp;
  
  FC_BPNN::FC_BPNN((FC_BPNN *)
                   &data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,4,10,1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_68);
  local_70 = 0.251;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_68,&local_70);
  local_88[0] = 0.425;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_68,local_88);
  local_90 = 0.775;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_68,&local_90);
  output.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fee76c8b4395810;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_68,
             (value_type *)
             &output.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&lastCost);
  cost = 0.0;
  dStack_c0 = 0.0;
  for (a._4_4_ = 1; a._4_4_ < 0x65; a._4_4_ = a._4_4_ + 1) {
    iVar1 = rand();
    b = (double)(iVar1 % 1000) / 1000.0;
    iVar1 = rand();
    c = (double)(iVar1 % 1000) / 1000.0;
    iVar1 = rand();
    d = (double)(iVar1 % 1000) / 1000.0;
    iVar1 = rand();
    local_118 = (double)(iVar1 % 1000) / 1000.0;
    local_130 = b;
    local_128 = c;
    local_120 = d;
    local_110 = &local_130;
    local_108 = 4;
    local_e8 = local_118;
    std::allocator<double>::allocator(&local_131);
    __l_00._M_len = local_108;
    __l_00._M_array = local_110;
    std::vector<double,_std::allocator<double>_>::vector(&local_100,__l_00,&local_131);
    local_168 = average4(b,c,d,local_e8);
    local_160 = &local_168;
    local_158 = 1;
    std::allocator<double>::allocator(&local_169);
    __l._M_len = local_158;
    __l._M_array = local_160;
    std::vector<double,_std::allocator<double>_>::vector(&local_150,__l,&local_169);
    dVar4 = FC_BPNN::train_once((FC_BPNN *)
                                &data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,&local_100,&local_150);
    dStack_c0 = dVar4 + dStack_c0;
    std::vector<double,_std::allocator<double>_>::~vector(&local_150);
    std::allocator<double>::~allocator(&local_169);
    std::vector<double,_std::allocator<double>_>::~vector(&local_100);
    std::allocator<double>::~allocator(&local_131);
    if (a._4_4_ % 10 == 0) {
      dStack_c0 = dStack_c0 / 10.0;
      poVar2 = std::operator<<((ostream *)&std::cout,"iter: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,a._4_4_);
      poVar2 = std::operator<<(poVar2," cost: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,dStack_c0);
      poVar2 = std::operator<<(poVar2," step: ");
      dVar4 = FC_BPNN::getLearningStep
                        ((FC_BPNN *)
                         &data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      cost = dStack_c0;
      dStack_c0 = 0.0;
    }
  }
  FC_BPNN::predict((FC_BPNN *)
                   &data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (vector<double,_std::allocator<double>_> *)local_68,
                   (vector<double,_std::allocator<double>_> *)&lastCost);
  poVar2 = std::operator<<((ostream *)&std::cout,"prediction: ");
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)&lastCost,0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar3);
  poVar2 = std::operator<<(poVar2," gt: ");
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_68,0);
  dVar4 = *pvVar3;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_68,1);
  b_00 = *pvVar3;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_68,2);
  c_00 = *pvVar3;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_68,3);
  dVar4 = average4(dVar4,b_00,c_00,*pvVar3);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&lastCost);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_68);
  FC_BPNN::~FC_BPNN((FC_BPNN *)
                    &data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  return 1;
}

Assistant:

int main_average() {
	FC_BPNN bp(4, 10, 1);
	std::vector<double> data; data.push_back(0.251); data.push_back(0.425); data.push_back(0.775); data.push_back(0.952);
	std::vector<double> output;
	double lastCost = 0.0; double cost = 0.0;
	for (int i = 1; i <= 100; i++) {
		double a = (double)(rand() % 1000) / 1000;
		double b = (double)(rand() % 1000) / 1000;
		double c = (double)(rand() % 1000) / 1000;
		double d = (double)(rand() % 1000) / 1000;
		cost += bp.train_once({ a ,b, c,d }, { average4(a,b,c,d) });
		if (i % 10 == 0) {
			cost /= 10;
			std::cout << "iter: " << i << " cost: " << cost << " step: " << bp.getLearningStep() << std::endl;
			lastCost = cost;
			cost = 0.0;
		}
	}
	bp.predict(data, output);
	std::cout << "prediction: " << output[0] << " gt: " << average4(data[0], data[1], data[2], data[3]) << std::endl;
	return 1;
}